

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ForeachLoopListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForeachLoopListSyntax,slang::syntax::ForeachLoopListSyntax_const&>
          (BumpAllocator *this,ForeachLoopListSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  Info *pIVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  ForeachLoopListSyntax *pFVar14;
  
  pFVar14 = (ForeachLoopListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForeachLoopListSyntax *)this->endPtr < pFVar14 + 1) {
    pFVar14 = (ForeachLoopListSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(pFVar14 + 1);
  }
  (pFVar14->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar5 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pFVar14->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pFVar14->super_SyntaxNode).field_0x4 = uVar5;
  (pFVar14->super_SyntaxNode).parent = pSVar1;
  (pFVar14->openBracket).info = (args->openBracket).info;
  TVar10 = (args->openParen).kind;
  uVar11 = (args->openParen).field_0x2;
  NVar12.raw = (args->openParen).numFlags.raw;
  uVar13 = (args->openParen).rawLen;
  pIVar2 = (args->openParen).info;
  TVar6 = (args->openBracket).kind;
  uVar7 = (args->openBracket).field_0x2;
  NVar8.raw = (args->openBracket).numFlags.raw;
  uVar9 = (args->openBracket).rawLen;
  (pFVar14->arrayName).ptr = (args->arrayName).ptr;
  (pFVar14->openBracket).kind = TVar6;
  (pFVar14->openBracket).field_0x2 = uVar7;
  (pFVar14->openBracket).numFlags = (NumericTokenFlags)NVar8.raw;
  (pFVar14->openBracket).rawLen = uVar9;
  (pFVar14->openParen).kind = TVar10;
  (pFVar14->openParen).field_0x2 = uVar11;
  (pFVar14->openParen).numFlags = (NumericTokenFlags)NVar12.raw;
  (pFVar14->openParen).rawLen = uVar13;
  (pFVar14->openParen).info = pIVar2;
  uVar5 = *(undefined4 *)&(args->loopVariables).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->loopVariables).super_SyntaxListBase.super_SyntaxNode.parent;
  (pFVar14->loopVariables).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->loopVariables).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pFVar14->loopVariables).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pFVar14->loopVariables).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pFVar14->loopVariables).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->loopVariables).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pFVar14->loopVariables).super_SyntaxListBase.childCount =
       (args->loopVariables).super_SyntaxListBase.childCount;
  (pFVar14->loopVariables).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005cb5d0;
  sVar3 = (args->loopVariables).elements._M_extent._M_extent_value;
  (pFVar14->loopVariables).elements._M_ptr = (args->loopVariables).elements._M_ptr;
  (pFVar14->loopVariables).elements._M_extent._M_extent_value = sVar3;
  uVar7 = (args->closeBracket).field_0x2;
  NVar8.raw = (args->closeBracket).numFlags.raw;
  uVar9 = (args->closeBracket).rawLen;
  pIVar2 = (args->closeBracket).info;
  TVar6 = (args->closeParen).kind;
  uVar11 = (args->closeParen).field_0x2;
  NVar12.raw = (args->closeParen).numFlags.raw;
  uVar13 = (args->closeParen).rawLen;
  pIVar4 = (args->closeParen).info;
  (pFVar14->closeBracket).kind = (args->closeBracket).kind;
  (pFVar14->closeBracket).field_0x2 = uVar7;
  (pFVar14->closeBracket).numFlags = (NumericTokenFlags)NVar8.raw;
  (pFVar14->closeBracket).rawLen = uVar9;
  (pFVar14->closeBracket).info = pIVar2;
  (pFVar14->closeParen).kind = TVar6;
  (pFVar14->closeParen).field_0x2 = uVar11;
  (pFVar14->closeParen).numFlags = (NumericTokenFlags)NVar12.raw;
  (pFVar14->closeParen).rawLen = uVar13;
  (pFVar14->closeParen).info = pIVar4;
  return pFVar14;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }